

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O3

int sndio_stream_stop(cubeb_stream_conflict2 *s)

{
  void *dummy;
  void *pvStack_8;
  
  if (s->active != 0) {
    s->active = 0;
    pthread_join(s->th,&pvStack_8);
  }
  return 0;
}

Assistant:

static int
sndio_stream_stop(cubeb_stream *s)
{
  void *dummy;

  DPR("sndio_stream_stop()\n");
  if (s->active) {
    s->active = 0;
    pthread_join(s->th, &dummy);
  }
  return CUBEB_OK;
}